

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O2

void __thiscall DNSResolver::reciveAndParse(DNSResolver *this)

{
  ushort uVar1;
  ssize_t sVar2;
  size_t sVar3;
  uchar *puVar4;
  uchar *puVar5;
  int *piVar6;
  int j;
  ulong uVar7;
  DNSResolver *this_00;
  int i;
  long lVar8;
  ulong uVar9;
  undefined8 local_228;
  int stop;
  RES_RECORD answers [20];
  
  sVar2 = recv(this->sockfd,this,0x10000,0);
  if (sVar2 < 1) {
    piVar6 = __errno_location();
    if (*piVar6 != 0xb) {
      this->drop = true;
    }
  }
  else {
    this->responseRecived = true;
    this_00 = (DNSResolver *)this->qname;
    sVar3 = strlen((char *)this_00);
    puVar5 = this->buf + sVar3 + 0x11;
    stop = 0;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      puVar4 = ReadName(this_00,puVar5,this->buf,&stop);
      answers[lVar8].name = puVar4;
      answers[lVar8].resource = (R_DATA *)(puVar5 + stop);
      puVar4 = puVar5 + stop + 10;
      if (*(short *)(puVar5 + stop) == 0x100) {
        uVar1 = ((R_DATA *)(puVar5 + stop))->data_len;
        uVar9 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
        this_00 = (DNSResolver *)(uVar9 + 1);
        puVar5 = (uchar *)malloc((size_t)this_00);
        answers[lVar8].rdata = puVar5;
        for (uVar7 = 0; uVar7 < uVar9; uVar7 = uVar7 + 1) {
          puVar5[uVar7] = puVar4[uVar7];
        }
        puVar5[uVar9] = '\0';
      }
      else {
        puVar5 = ReadName(this_00,puVar4,this->buf,&stop);
        answers[lVar8].rdata = puVar5;
        uVar9 = (ulong)stop;
      }
      puVar5 = puVar4 + uVar9;
    }
    uVar1 = this->dns->ans_count;
    if ((1 < (ushort)(uVar1 << 8 | uVar1 >> 8)) || (answers[1].rdata = answers[0].rdata, uVar1 != 0)
       ) {
      this->s_addr = *(long *)answers[1].rdata;
    }
    for (lVar8 = 0x10; lVar8 != 0x40; lVar8 = lVar8 + 0x18) {
      free(*(void **)((long)&answers[0].name + lVar8));
      free(*(void **)((long)&local_228 + lVar8));
    }
  }
  return;
}

Assistant:

void DNSResolver::reciveAndParse() {
    if (::recv(sockfd, (char *) buf, 65536, 0) <= 0) {
        if (errno != EWOULDBLOCK) {
            drop = true;
        }
        return;
    }
    responseRecived = true;

    struct RES_RECORD answers[20];
    unsigned char *reader = &buf[sizeof(struct DNS_HEADER) + (strlen((const char *) qname) + 1) +
                                 sizeof(struct QUESTION)];

    //Start reading answers
    int stop = 0;
    for (int i = 0; i < 2; i++) {
        answers[i].name = ReadName(reader, buf, &stop);
        reader = reader + stop;

        answers[i].resource = (struct R_DATA *) (reader);
        reader = reader + sizeof(struct R_DATA);

        if (ntohs(answers[i].resource->type) == 1) //if its an ipv4 address
        {
            answers[i].rdata = (unsigned char *) malloc(ntohs(answers[i].resource->data_len) + 1);

            for (int j = 0; j < ntohs(answers[i].resource->data_len); j++) {
                answers[i].rdata[j] = reader[j];
            }

            answers[i].rdata[ntohs(answers[i].resource->data_len)] = '\0';

            reader = reader + ntohs(answers[i].resource->data_len);
        } else {
            answers[i].rdata = ReadName(reader, buf, &stop);
            reader = reader + stop;
        }
    }
    if (ntohs(dns->ans_count) > 1)
        s_addr = *((long *) answers[1].rdata);
    else if (ntohs(dns->ans_count) > 0)
        s_addr = *((long *) answers[0].rdata);
    for (int i = 0; i < 2; i++) {
               free(answers[i].rdata);
               free(answers[i].name);
    }
}